

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# claim_strategy_test.cc
# Opt level: O0

void __thiscall
disruptor::test::SingleThreadedStrategy::HasAvailableCapacity::~HasAvailableCapacity
          (HasAvailableCapacity *this)

{
  ClaimStrategyFixture<disruptor::SingleThreadedStrategy>::~ClaimStrategyFixture
            ((ClaimStrategyFixture<disruptor::SingleThreadedStrategy> *)0x1152de);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(HasAvailableCapacity) {
  auto one_dependents = oneDependents();

  int64_t return_value =
      strategy.IncrementAndGet(cursor, one_dependents, RING_BUFFER_SIZE);
  BOOST_CHECK_EQUAL(return_value, kInitialCursorValue + RING_BUFFER_SIZE);
  BOOST_CHECK_EQUAL(
      strategy.HasAvailableCapacity(one_dependents, cursor.sequence()), false);

  // advance late consumers
  sequence_1.IncrementAndGet(1L);
  BOOST_CHECK_EQUAL(
      strategy.HasAvailableCapacity(one_dependents, cursor.sequence()), true);

  // only one slot free
  BOOST_CHECK_EQUAL(strategy.IncrementAndGet(cursor, one_dependents),
                    return_value + 1L);

  // dependent keeps up
  sequence_1.IncrementAndGet(RING_BUFFER_SIZE);

  // all equals
  BOOST_CHECK_EQUAL(
      strategy.IncrementAndGet(cursor, one_dependents, RING_BUFFER_SIZE),
      sequence_1.IncrementAndGet(RING_BUFFER_SIZE));
}